

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

mp_limb_t mpn_addmul_1(mp_ptr rp,mp_srcptr up,mp_size_t n,mp_limb_t vl)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  if (0 < n) {
    lVar5 = 0;
    uVar2 = 0;
    do {
      uVar6 = up[lVar5] & 0xffffffff;
      uVar3 = up[lVar5] >> 0x20;
      uVar7 = uVar6 * (vl & 0xffffffff);
      uVar9 = uVar3 * (vl & 0xffffffff);
      lVar4 = uVar3 * (vl >> 0x20);
      uVar3 = uVar6 * (vl >> 0x20) + uVar9 + (uVar7 >> 0x20);
      lVar8 = lVar4 + 0x100000000;
      if (uVar9 <= uVar3) {
        lVar8 = lVar4;
      }
      uVar7 = (uVar7 & 0xffffffff) + uVar2 + (uVar3 << 0x20);
      puVar1 = rp + lVar5;
      uVar6 = *puVar1;
      *puVar1 = *puVar1 + uVar7;
      uVar2 = (ulong)(uVar7 < uVar2) + (uVar3 >> 0x20) + lVar8 + (ulong)CARRY8(uVar6,uVar7);
      lVar5 = lVar5 + 1;
    } while (n != lVar5);
    return uVar2;
  }
  __assert_fail("n >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x20f,"mp_limb_t mpn_addmul_1(mp_ptr, mp_srcptr, mp_size_t, mp_limb_t)");
}

Assistant:

mp_limb_t
mpn_addmul_1 (mp_ptr rp, mp_srcptr up, mp_size_t n, mp_limb_t vl)
{
  mp_limb_t ul, cl, hpl, lpl, rl;

  assert (n >= 1);

  cl = 0;
  do
    {
      ul = *up++;
      gmp_umul_ppmm (hpl, lpl, ul, vl);

      lpl += cl;
      cl = (lpl < cl) + hpl;

      rl = *rp;
      lpl = rl + lpl;
      cl += lpl < rl;
      *rp++ = lpl;
    }
  while (--n != 0);

  return cl;
}